

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

int TIFFFetchStripThing(TIFF *tif,TIFFDirEntry *dir,uint32_t nstrips,uint64_t **lpp)

{
  TIFFField *pTVar1;
  char *__nptr;
  char *local_88;
  char *local_78;
  uint local_64;
  uint32_t max_nstrips;
  char *pszMax;
  TIFFField *fip_1;
  uint64_t *resizeddata;
  TIFFField *fip;
  uint64_t *data;
  uint64_t **ppuStack_30;
  TIFFReadDirEntryErr err;
  uint64_t **lpp_local;
  TIFFDirEntry *pTStack_20;
  uint32_t nstrips_local;
  TIFFDirEntry *dir_local;
  TIFF *tif_local;
  
  ppuStack_30 = lpp;
  lpp_local._4_4_ = nstrips;
  pTStack_20 = dir;
  dir_local = (TIFFDirEntry *)tif;
  data._4_4_ = TIFFReadDirEntryLong8ArrayWithLimit(tif,dir,(uint64_t **)&fip,(ulong)nstrips);
  if (data._4_4_ != TIFFReadDirEntryErrOk) {
    pTVar1 = TIFFFieldWithTag((TIFF *)dir_local,(uint)pTStack_20->tdir_tag);
    if (pTVar1 == (TIFFField *)0x0) {
      local_78 = "unknown tagname";
    }
    else {
      local_78 = pTVar1->field_name;
    }
    TIFFReadDirEntryOutputErr((TIFF *)dir_local,data._4_4_,"TIFFFetchStripThing",local_78,0);
    return 0;
  }
  if (pTStack_20->tdir_count < (ulong)lpp_local._4_4_) {
    pTVar1 = TIFFFieldWithTag((TIFF *)dir_local,(uint)pTStack_20->tdir_tag);
    __nptr = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
    local_64 = 1000000;
    if (__nptr != (char *)0x0) {
      local_64 = atoi(__nptr);
    }
    if (pTVar1 == (TIFFField *)0x0) {
      local_88 = "unknown tagname";
    }
    else {
      local_88 = pTVar1->field_name;
    }
    TIFFReadDirEntryOutputErr
              ((TIFF *)dir_local,TIFFReadDirEntryErrCount,"TIFFFetchStripThing",local_88,
               (uint)(lpp_local._4_4_ <= local_64));
    if (local_64 < lpp_local._4_4_) {
      _TIFFfreeExt((TIFF *)dir_local,fip);
      return 0;
    }
    pTVar1 = (TIFFField *)
             _TIFFCheckMalloc((TIFF *)dir_local,(ulong)lpp_local._4_4_,8,"for strip array");
    if (pTVar1 == (TIFFField *)0x0) {
      _TIFFfreeExt((TIFF *)dir_local,fip);
      return 0;
    }
    if (pTStack_20->tdir_count != 0) {
      _TIFFmemcpy(pTVar1,fip,(pTStack_20->tdir_count & 0xffffffff) << 3);
    }
    _TIFFmemset(&pTVar1->field_tag + (pTStack_20->tdir_count & 0xffffffff) * 2,0,
                (ulong)(lpp_local._4_4_ - (int)pTStack_20->tdir_count) << 3);
    _TIFFfreeExt((TIFF *)dir_local,fip);
    fip = pTVar1;
  }
  *ppuStack_30 = (uint64_t *)fip;
  return 1;
}

Assistant:

static int TIFFFetchStripThing(TIFF *tif, TIFFDirEntry *dir, uint32_t nstrips,
                               uint64_t **lpp)
{
    static const char module[] = "TIFFFetchStripThing";
    enum TIFFReadDirEntryErr err;
    uint64_t *data;
    err = TIFFReadDirEntryLong8ArrayWithLimit(tif, dir, &data, nstrips);
    if (err != TIFFReadDirEntryErrOk)
    {
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        TIFFReadDirEntryOutputErr(tif, err, module,
                                  fip ? fip->field_name : "unknown tagname", 0);
        return (0);
    }
    if (dir->tdir_count < (uint64_t)nstrips)
    {
        uint64_t *resizeddata;
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        const char *pszMax = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
        uint32_t max_nstrips = 1000000;
        if (pszMax)
            max_nstrips = (uint32_t)atoi(pszMax);
        TIFFReadDirEntryOutputErr(tif, TIFFReadDirEntryErrCount, module,
                                  fip ? fip->field_name : "unknown tagname",
                                  (nstrips <= max_nstrips));

        if (nstrips > max_nstrips)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }

        resizeddata = (uint64_t *)_TIFFCheckMalloc(
            tif, nstrips, sizeof(uint64_t), "for strip array");
        if (resizeddata == 0)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }
        if (dir->tdir_count)
            _TIFFmemcpy(resizeddata, data,
                        (uint32_t)dir->tdir_count * sizeof(uint64_t));
        _TIFFmemset(resizeddata + (uint32_t)dir->tdir_count, 0,
                    (nstrips - (uint32_t)dir->tdir_count) * sizeof(uint64_t));
        _TIFFfreeExt(tif, data);
        data = resizeddata;
    }
    *lpp = data;
    return (1);
}